

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O2

Vector3f __thiscall pbrt::BSDF::LocalToRender(BSDF *this,Vector3f *v)

{
  Tuple3<pbrt::Vector3,_float> TVar1;
  
  TVar1 = (Tuple3<pbrt::Vector3,_float>)
          Frame::FromLocal(&this->shadingFrame,(Vector3f)v->super_Tuple3<pbrt::Vector3,_float>);
  return (Vector3f)TVar1;
}

Assistant:

PBRT_CPU_GPU
    Vector3f LocalToRender(const Vector3f &v) const { return shadingFrame.FromLocal(v); }